

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void add_stone_to_deploy_msg
               (EVdfg_configuration config,EVdfg_deploy_msg *msg,EVdfg_stone_state dstone)

{
  undefined8 *puVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  pvVar3 = INT_CMrealloc(*(void **)&config->pending_action_count,
                         (long)*(int *)&config->stones * 0x40 + 0x40);
  *(void **)&config->pending_action_count = pvVar3;
  lVar6 = (long)*(int *)&config->stones * 0x40;
  *(undefined8 *)((long)pvVar3 + lVar6) = 0;
  ((undefined8 *)((long)pvVar3 + lVar6))[1] = 0;
  puVar1 = (undefined8 *)((long)pvVar3 + lVar6 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)pvVar3 + lVar6 + 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)pvVar3 + lVar6 + 0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  lVar6 = *(long *)&config->pending_action_count;
  lVar7 = (long)*(int *)&config->stones * 0x40;
  *(int *)(lVar6 + lVar7) = msg->stone_count;
  *(undefined8 *)(lVar6 + 8 + lVar7) = 0;
  lVar6 = lVar6 + lVar7;
  if (msg->stone_list != (deploy_msg_stone)0x0) {
    uVar4 = attr_list_to_string();
    *(undefined8 *)(lVar6 + 8) = uVar4;
  }
  *(char **)(lVar6 + 0x10) = msg[1].canonical_name;
  if (*(int *)((long)&msg->canonical_name + 4) == 0) {
    iVar2 = msg[1].stone_count;
    *(int *)(lVar6 + 0x18) = iVar2;
    pvVar3 = INT_CMmalloc((long)iVar2 << 2);
    *(void **)(lVar6 + 0x20) = pvVar3;
    for (lVar7 = 0; lVar7 < msg[1].stone_count; lVar7 = lVar7 + 1) {
      *(int *)((long)pvVar3 + lVar7 * 4) = (&(msg[1].stone_list)->global_stone_id)[lVar7];
    }
  }
  else {
    *(undefined4 *)(lVar6 + 0x18) = 0;
    *(undefined8 *)(lVar6 + 0x20) = 0;
  }
  *(char **)(lVar6 + 0x28) = msg[3].canonical_name;
  if (*(int *)&msg[2].stone_list < 2) {
    *(undefined4 *)(lVar6 + 0x30) = 0;
    *(undefined8 *)(lVar6 + 0x38) = 0;
  }
  else {
    uVar9 = *(int *)&msg[2].stone_list - 1;
    *(uint *)(lVar6 + 0x30) = uVar9;
    pvVar3 = INT_CMmalloc((ulong)uVar9 << 3);
    *(void **)(lVar6 + 0x38) = pvVar3;
    uVar8 = 0;
    uVar5 = (ulong)*(uint *)(lVar6 + 0x30);
    if ((int)*(uint *)(lVar6 + 0x30) < 1) {
      uVar5 = uVar8;
    }
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined8 *)(*(long *)(lVar6 + 0x38) + uVar8 * 8) =
           *(undefined8 *)(*(long *)&msg[3].stone_count + uVar8 * 8);
    }
  }
  *(int *)&config->stones = *(int *)&config->stones + 1;
  return;
}

Assistant:

static void
add_stone_to_deploy_msg(EVdfg_configuration config, EVdfg_deploy_msg *msg, EVdfg_stone_state dstone) 	    
{
    deploy_msg_stone mstone;
    int k;
    msg->stone_list = realloc(msg->stone_list, (msg->stone_count +1) * sizeof(msg->stone_list[0]));
    memset(&msg->stone_list[msg->stone_count], 0, sizeof(msg->stone_list[0]));
    mstone = &msg->stone_list[msg->stone_count];
    mstone->global_stone_id = dstone->stone_id;
    mstone->attrs = NULL;
    if (dstone->attrs != NULL) {
	mstone->attrs = attr_list_to_string(dstone->attrs);
    }
    mstone->period_secs = dstone->period_secs;
    mstone->period_usecs = dstone->period_usecs;
    if (dstone->bridge_stone) {
	/* bridge stone virtual links should not be deployed, just for bookkeeping */
	mstone->out_count = 0;
	mstone->out_links = NULL;
    } else {
	mstone->out_count = dstone->out_count;
	mstone->out_links = malloc(sizeof(mstone->out_links[0])*mstone->out_count);
	for (k=0; k< dstone->out_count; k++) {
	    if (dstone->out_links[k] != -1) {
		mstone->out_links[k] = dstone->out_links[k];
	    } else {
		mstone->out_links[k] = -1;
	    }
	}
    }
    mstone->action = dstone->action;
    if (dstone->action_count > 1) {
	mstone->extra_actions = dstone->action_count - 1;
	mstone->xactions = malloc(sizeof(mstone->xactions[0])*mstone->extra_actions);
	for (k=0; k < mstone->extra_actions; k++) {
	    mstone->xactions[k] = dstone->extra_actions[k];
	}
    } else {
	mstone->extra_actions = 0;
	mstone->xactions = NULL;
    }
    msg->stone_count++;
}